

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

TV __thiscall Nova::Grid<float,_3>::Face(Grid<float,_3> *this,int axis,T_INDEX *index)

{
  float *pfVar1;
  Vector<int,_3,_true> *in_RCX;
  Vector<float,_3,_true> *data_copy_2;
  undefined4 in_register_00000034;
  long lVar2;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  TV TVar3;
  Vector<float,_3,_true> data_copy_1;
  TV shifted_index;
  Vector<float,_3,_true> local_48;
  Vector<float,_3,_true> local_38;
  
  lVar2 = CONCAT44(in_register_00000034,axis);
  Vector<float,_3,_true>::Vector<int>(&local_48,in_RCX);
  local_38._data._M_elems[2] = local_48._data._M_elems[2];
  local_38._data._M_elems[0] = local_48._data._M_elems[0];
  local_38._data._M_elems[1] = local_48._data._M_elems[1];
  Vector<float,_3,_true>::operator-=(&local_38,0.5);
  pfVar1 = Vector<float,_3,_true>::operator()(&local_38,(int)index);
  *pfVar1 = *pfVar1 + -0.5;
  local_48._data._M_elems[2] = local_38._data._M_elems[2];
  local_48._data._M_elems[0] = local_38._data._M_elems[0];
  local_48._data._M_elems[1] = local_38._data._M_elems[1];
  Vector<float,_3,_true>::operator*=(&local_48,(Vector<float,_3,_true> *)(lVar2 + 0x24));
  *(undefined8 *)(this->counts)._data._M_elems = *(undefined8 *)(lVar2 + 0xc);
  (this->counts)._data._M_elems[2] = *(int *)(lVar2 + 0x14);
  Vector<float,_3,_true>::operator+=((Vector<float,_3,_true> *)this,&local_48);
  TVar3._data._M_elems[2] = in_XMM1_Da;
  TVar3._data._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  TVar3._data._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (TV)TVar3._data._M_elems;
}

Assistant:

TV Face(const int axis,const T_INDEX& index) const
    {
        TV shifted_index(TV(index)-(T).5);
        shifted_index(axis)-=(T).5;
        return domain.min_corner+shifted_index*dX;
    }